

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O0

void google::protobuf::TestUtil::
     ExpectLastRepeatedExtensionsRemovedPacked<proto2_unittest::TestPackedExtensions>
               (TestPackedExtensions *message)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_4d8;
  Message local_4d0;
  ConstType local_4c4;
  undefined1 local_4c0 [8];
  AssertionResult gtest_ar_26;
  AssertHelper local_490;
  Message local_488;
  bool local_479;
  undefined1 local_478 [8];
  AssertionResult gtest_ar_;
  Message local_460;
  ConstType_conflict5 local_458;
  int local_44c;
  undefined1 local_448 [8];
  AssertionResult gtest_ar_25;
  Message local_430;
  ConstType_conflict4 local_428;
  int local_424;
  undefined1 local_420 [8];
  AssertionResult gtest_ar_24;
  Message local_408;
  ConstType_conflict1 local_400;
  int local_3f4;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar_23;
  Message local_3d8;
  ConstType local_3d0;
  int local_3cc;
  undefined1 local_3c8 [8];
  AssertionResult gtest_ar_22;
  Message local_3b0;
  ConstType_conflict local_3a8;
  int local_39c;
  undefined1 local_398 [8];
  AssertionResult gtest_ar_21;
  Message local_380;
  ConstType_conflict3 local_378 [2];
  undefined1 local_370 [8];
  AssertionResult gtest_ar_20;
  Message local_358;
  ConstType_conflict1 local_350;
  int local_344;
  undefined1 local_340 [8];
  AssertionResult gtest_ar_19;
  Message local_328;
  ConstType local_320;
  int local_31c;
  undefined1 local_318 [8];
  AssertionResult gtest_ar_18;
  Message local_300;
  ConstType_conflict local_2f8;
  int local_2ec;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar_17;
  Message local_2d0;
  ConstType_conflict3 local_2c8 [2];
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar_16;
  Message local_2a8;
  ConstType_conflict1 local_2a0;
  int local_294;
  undefined1 local_290 [8];
  AssertionResult gtest_ar_15;
  Message local_278;
  ConstType local_270;
  int local_26c;
  undefined1 local_268 [8];
  AssertionResult gtest_ar_14;
  Message local_250;
  int local_248 [2];
  undefined1 local_240 [8];
  AssertionResult gtest_ar_13;
  Message local_228;
  int local_220 [2];
  undefined1 local_218 [8];
  AssertionResult gtest_ar_12;
  Message local_200;
  int local_1f8 [2];
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar_11;
  Message local_1d8;
  int local_1d0 [2];
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_10;
  Message local_1b0;
  int local_1a8 [2];
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_9;
  Message local_188;
  int local_180 [2];
  undefined1 local_178 [8];
  AssertionResult gtest_ar_8;
  Message local_160;
  int local_158 [2];
  undefined1 local_150 [8];
  AssertionResult gtest_ar_7;
  Message local_138;
  int local_130 [2];
  undefined1 local_128 [8];
  AssertionResult gtest_ar_6;
  Message local_110;
  int local_108 [2];
  undefined1 local_100 [8];
  AssertionResult gtest_ar_5;
  Message local_e8;
  int local_e0 [2];
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_4;
  Message local_c0;
  int local_b8 [2];
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_3;
  Message local_98;
  int local_90 [2];
  undefined1 local_88 [8];
  AssertionResult gtest_ar_2;
  Message local_70;
  int local_68 [2];
  undefined1 local_60 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_48 [3];
  Message local_30;
  int local_28 [2];
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  TestPackedExtensions *message_local;
  
  local_28[1] = 1;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )message;
  local_28[0] = proto2_unittest::TestPackedExtensions::
                ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,(unsigned_char)5,true,google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>>
                          (message,(ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_true>
                                    *)&proto2_unittest::packed_int32_extension);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_20,"1","message.ExtensionSize(Traits::packed_int32_extension)",
             local_28 + 1,local_28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(&local_30);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0xeea,pcVar2);
    testing::internal::AssertHelper::operator=(local_48,&local_30);
    testing::internal::AssertHelper::~AssertHelper(local_48);
    testing::Message::~Message(&local_30);
  }
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  if (gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_68[1] = 1;
    local_68[0] = proto2_unittest::TestPackedExtensions::
                  ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,(unsigned_char)3,true,google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>>
                            ((TestPackedExtensions *)
                             gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl,
                             (ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x03_,_true>
                              *)proto2_unittest::packed_int64_extension);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_60,"1","message.ExtensionSize(Traits::packed_int64_extension)",
               local_68 + 1,local_68);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
    if (!bVar1) {
      testing::Message::Message(&local_70);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xeeb,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_70);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_70);
    }
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
    if (gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      local_90[1] = 1;
      local_90[0] = proto2_unittest::TestPackedExtensions::
                    ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,(unsigned_char)13,true,google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>>
                              ((TestPackedExtensions *)
                               gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl,
                               (ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,_(unsigned_char)__r_,_true>
                                *)&proto2_unittest::packed_uint32_extension);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_88,"1","message.ExtensionSize(Traits::packed_uint32_extension)",
                 local_90 + 1,local_90);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
      if (!bVar1) {
        testing::Message::Message(&local_98);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                   ,0xeec,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_98);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_98);
      }
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
      if (gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        local_b8[1] = 1;
        local_b8[0] = proto2_unittest::TestPackedExtensions::
                      ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,(unsigned_char)4,true,google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>>
                                ((TestPackedExtensions *)
                                 gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl,
                                 (ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x04_,_true>
                                  *)proto2_unittest::packed_uint64_extension);
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((EqHelper *)local_b0,"1","message.ExtensionSize(Traits::packed_uint64_extension)"
                   ,local_b8 + 1,local_b8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
        if (!bVar1) {
          testing::Message::Message(&local_c0);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                     ,0xeed,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_c0)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
          testing::Message::~Message(&local_c0);
        }
        gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
        if (gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          local_e0[1] = 1;
          local_e0[0] = proto2_unittest::TestPackedExtensions::
                        ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,(unsigned_char)17,true,google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>>
                                  ((TestPackedExtensions *)
                                   gtest_ar.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl,
                                   (ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x11_,_true>
                                    *)&proto2_unittest::packed_sint32_extension);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_d8,"1",
                     "message.ExtensionSize(Traits::packed_sint32_extension)",local_e0 + 1,local_e0)
          ;
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
          if (!bVar1) {
            testing::Message::Message(&local_e8);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                       ,0xeee,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_5.message_,&local_e8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
            testing::Message::~Message(&local_e8);
          }
          gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
          if (gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            local_108[1] = 1;
            local_108[0] = proto2_unittest::TestPackedExtensions::
                           ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,(unsigned_char)18,true,google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>>
                                     ((TestPackedExtensions *)
                                      gtest_ar.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl,
                                      (ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x12_,_true>
                                       *)proto2_unittest::packed_sint64_extension);
            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                      ((EqHelper *)local_100,"1",
                       "message.ExtensionSize(Traits::packed_sint64_extension)",local_108 + 1,
                       local_108);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
            if (!bVar1) {
              testing::Message::Message(&local_110);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_6.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                         ,0xeef,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_6.message_,&local_110);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
              testing::Message::~Message(&local_110);
            }
            gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._5_3_ = 0;
            gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
            if (gtest_ar_1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0) {
              local_130[1] = 1;
              local_130[0] = proto2_unittest::TestPackedExtensions::
                             ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,(unsigned_char)7,true,google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>>
                                       ((TestPackedExtensions *)
                                        gtest_ar.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl,
                                        (ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,_(unsigned_char)__a_,_true>
                                         *)&proto2_unittest::packed_fixed32_extension);
              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                        ((EqHelper *)local_128,"1",
                         "message.ExtensionSize(Traits::packed_fixed32_extension)",local_130 + 1,
                         local_130);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
              if (!bVar1) {
                testing::Message::Message(&local_138);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_7.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                           ,0xef0,pcVar2);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_7.message_,&local_138);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_)
                ;
                testing::Message::~Message(&local_138);
              }
              gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._5_3_ = 0;
              gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
              if (gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_ == 0) {
                local_158[1] = 1;
                local_158[0] = proto2_unittest::TestPackedExtensions::
                               ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,(unsigned_char)6,true,google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>>
                                         ((TestPackedExtensions *)
                                          gtest_ar.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl,
                                          (ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x06_,_true>
                                           *)proto2_unittest::packed_fixed64_extension);
                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                          ((EqHelper *)local_150,"1",
                           "message.ExtensionSize(Traits::packed_fixed64_extension)",local_158 + 1,
                           local_158);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_150);
                if (!bVar1) {
                  testing::Message::Message(&local_160);
                  pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_8.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                             ,0xef1,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_8.message_,&local_160);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_8.message_);
                  testing::Message::~Message(&local_160);
                }
                gtest_ar_1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._5_3_ = 0;
                gtest_ar_1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
                if (gtest_ar_1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_4_ == 0) {
                  local_180[1] = 1;
                  local_180[0] = proto2_unittest::TestPackedExtensions::
                                 ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,(unsigned_char)15,true,google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>>
                                           ((TestPackedExtensions *)
                                            gtest_ar.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl,
                                            (ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x0f_,_true>
                                             *)&proto2_unittest::packed_sfixed32_extension);
                  testing::internal::EqHelper::Compare<int,_int,_nullptr>
                            ((EqHelper *)local_178,"1",
                             "message.ExtensionSize(Traits::packed_sfixed32_extension)",
                             local_180 + 1,local_180);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_178);
                  if (!bVar1) {
                    testing::Message::Message(&local_188);
                    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_178)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_9.message_,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                               ,0xef2,pcVar2);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_9.message_,&local_188);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_9.message_);
                    testing::Message::~Message(&local_188);
                  }
                  gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._5_3_ = 0;
                  gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_1_ = !bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
                  if (gtest_ar_1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_4_ == 0) {
                    local_1a8[1] = 1;
                    local_1a8[0] = proto2_unittest::TestPackedExtensions::
                                   ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,(unsigned_char)16,true,google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>>
                                             ((TestPackedExtensions *)
                                              gtest_ar.message_._M_t.
                                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              ._M_head_impl,
                                              (ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x10_,_true>
                                               *)proto2_unittest::packed_sfixed64_extension);
                    testing::internal::EqHelper::Compare<int,_int,_nullptr>
                              ((EqHelper *)local_1a0,"1",
                               "message.ExtensionSize(Traits::packed_sfixed64_extension)",
                               local_1a8 + 1,local_1a8);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_1a0);
                    if (!bVar1) {
                      testing::Message::Message(&local_1b0);
                      pcVar2 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_1a0);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar_10.message_,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                 ,0xef3,pcVar2);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar_10.message_,&local_1b0);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)&gtest_ar_10.message_);
                      testing::Message::~Message(&local_1b0);
                    }
                    gtest_ar_1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._5_3_ = 0;
                    gtest_ar_1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_1_ = !bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
                    if (gtest_ar_1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_4_ == 0) {
                      local_1d0[1] = 1;
                      local_1d0[0] = proto2_unittest::TestPackedExtensions::
                                     ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<float>,(unsigned_char)2,true,google::protobuf::internal::RepeatedPrimitiveTypeTraits<float>>
                                               ((TestPackedExtensions *)
                                                gtest_ar.message_._M_t.
                                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                ._M_head_impl,
                                                (ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<float>,_(unsigned_char)__x02_,_true>
                                                 *)&proto2_unittest::packed_float_extension);
                      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                ((EqHelper *)local_1c8,"1",
                                 "message.ExtensionSize(Traits::packed_float_extension)",
                                 local_1d0 + 1,local_1d0);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_1c8);
                      if (!bVar1) {
                        testing::Message::Message(&local_1d8);
                        pcVar2 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)local_1c8);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&gtest_ar_11.message_,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                   ,0xef4,pcVar2);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&gtest_ar_11.message_,&local_1d8);
                        testing::internal::AssertHelper::~AssertHelper
                                  ((AssertHelper *)&gtest_ar_11.message_);
                        testing::Message::~Message(&local_1d8);
                      }
                      gtest_ar_1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._5_3_ = 0;
                      gtest_ar_1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_1_ = !bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
                      if (gtest_ar_1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_4_ == 0) {
                        local_1f8[1] = 1;
                        local_1f8[0] = proto2_unittest::TestPackedExtensions::
                                       ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<double>,(unsigned_char)1,true,google::protobuf::internal::RepeatedPrimitiveTypeTraits<double>>
                                                 ((TestPackedExtensions *)
                                                  gtest_ar.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<double>,_(unsigned_char)__x01_,_true>
                                                  *)proto2_unittest::packed_double_extension);
                        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                  ((EqHelper *)local_1f0,"1",
                                   "message.ExtensionSize(Traits::packed_double_extension)",
                                   local_1f8 + 1,local_1f8);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_1f0);
                        if (!bVar1) {
                          testing::Message::Message(&local_200);
                          pcVar2 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)local_1f0);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar_12.message_,kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                     ,0xef5,pcVar2);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar_12.message_,&local_200);
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)&gtest_ar_12.message_);
                          testing::Message::~Message(&local_200);
                        }
                        gtest_ar_1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._5_3_ = 0;
                        gtest_ar_1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_1_ = !bVar1;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
                        if (gtest_ar_1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_4_ == 0) {
                          local_220[1] = 1;
                          local_220[0] = proto2_unittest::TestPackedExtensions::
                                         ExtensionSize<google::protobuf::internal::RepeatedPrimitiveTypeTraits<bool>,(unsigned_char)8,true,google::protobuf::internal::RepeatedPrimitiveTypeTraits<bool>>
                                                   ((TestPackedExtensions *)
                                                    gtest_ar.message_._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<bool>,_(unsigned_char)__b_,_true>
                                                  *)&proto2_unittest::packed_bool_extension);
                          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                    ((EqHelper *)local_218,"1",
                                     "message.ExtensionSize(Traits::packed_bool_extension)",
                                     local_220 + 1,local_220);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_218);
                          if (!bVar1) {
                            testing::Message::Message(&local_228);
                            pcVar2 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)local_218);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar_13.message_,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                       ,0xef6,pcVar2);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar_13.message_,&local_228);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar_13.message_);
                            testing::Message::~Message(&local_228);
                          }
                          gtest_ar_1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._5_3_ = 0;
                          gtest_ar_1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_1_ = !bVar1;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
                          if (gtest_ar_1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_4_ == 0) {
                            local_248[1] = 1;
                            local_248[0] = proto2_unittest::TestPackedExtensions::
                                           ExtensionSize<google::protobuf::internal::RepeatedEnumTypeTraits<proto2_unittest::ForeignEnum>,(unsigned_char)14,true,google::protobuf::internal::RepeatedEnumTypeTraits<proto2_unittest::ForeignEnum>>
                                                     ((TestPackedExtensions *)
                                                      gtest_ar.message_._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedEnumTypeTraits<proto2_unittest::ForeignEnum>,_(unsigned_char)__x0e_,_true>
                                                  *)&proto2_unittest::packed_enum_extension);
                            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                      ((EqHelper *)local_240,"1",
                                       "message.ExtensionSize(Traits::packed_enum_extension)",
                                       local_248 + 1,local_248);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_240);
                            if (!bVar1) {
                              testing::Message::Message(&local_250);
                              pcVar2 = testing::AssertionResult::failure_message
                                                 ((AssertionResult *)local_240);
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&gtest_ar_14.message_,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                         ,0xef7,pcVar2);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&gtest_ar_14.message_,&local_250);
                              testing::internal::AssertHelper::~AssertHelper
                                        ((AssertHelper *)&gtest_ar_14.message_);
                              testing::Message::~Message(&local_250);
                            }
                            gtest_ar_1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._5_3_ = 0;
                            gtest_ar_1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_1_ = !bVar1;
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_240)
                            ;
                            if (gtest_ar_1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_4_ == 0) {
                              local_26c = 0x259;
                              local_270 = proto2_unittest::TestPackedExtensions::
                                          GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_true,_0>
                                                    ((TestPackedExtensions *)
                                                     gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_true>
                                                  *)&proto2_unittest::packed_int32_extension,0);
                              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                        ((EqHelper *)local_268,"601",
                                         "message.GetExtension(Traits::packed_int32_extension, 0)",
                                         &local_26c,&local_270);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_268);
                              if (!bVar1) {
                                testing::Message::Message(&local_278);
                                pcVar2 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_268);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0xefa,pcVar2);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_15.message_,&local_278);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_15.message_);
                                testing::Message::~Message(&local_278);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_268);
                              local_294 = 0x25a;
                              local_2a0 = proto2_unittest::TestPackedExtensions::
                                          GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x03_,_true,_0>
                                                    ((TestPackedExtensions *)
                                                     gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x03_,_true>
                                                  *)proto2_unittest::packed_int64_extension,0);
                              testing::internal::EqHelper::Compare<int,_long,_nullptr>
                                        ((EqHelper *)local_290,"602",
                                         "message.GetExtension(Traits::packed_int64_extension, 0)",
                                         &local_294,&local_2a0);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_290);
                              if (!bVar1) {
                                testing::Message::Message(&local_2a8);
                                pcVar2 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_290);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0xefb,pcVar2);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_16.message_,&local_2a8);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_16.message_);
                                testing::Message::~Message(&local_2a8);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_290);
                              local_2c8[1] = 0x25b;
                              local_2c8[0] = proto2_unittest::TestPackedExtensions::
                                             GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,_(unsigned_char)__r_,_true,_0>
                                                       ((TestPackedExtensions *)
                                                        gtest_ar.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,_(unsigned_char)__r_,_true>
                                                  *)&proto2_unittest::packed_uint32_extension,0);
                              testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
                                        ((EqHelper *)local_2c0,"603",
                                         "message.GetExtension(Traits::packed_uint32_extension, 0)",
                                         (int *)(local_2c8 + 1),local_2c8);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_2c0);
                              if (!bVar1) {
                                testing::Message::Message(&local_2d0);
                                pcVar2 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_2c0);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0xefc,pcVar2);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_17.message_,&local_2d0);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_17.message_);
                                testing::Message::~Message(&local_2d0);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_2c0);
                              local_2ec = 0x25c;
                              local_2f8 = proto2_unittest::TestPackedExtensions::
                                          GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x04_,_true,_0>
                                                    ((TestPackedExtensions *)
                                                     gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x04_,_true>
                                                  *)proto2_unittest::packed_uint64_extension,0);
                              testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
                                        ((EqHelper *)local_2e8,"604",
                                         "message.GetExtension(Traits::packed_uint64_extension, 0)",
                                         &local_2ec,&local_2f8);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_2e8);
                              if (!bVar1) {
                                testing::Message::Message(&local_300);
                                pcVar2 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_2e8);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0xefd,pcVar2);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_18.message_,&local_300);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_18.message_);
                                testing::Message::~Message(&local_300);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_2e8);
                              local_31c = 0x25d;
                              local_320 = proto2_unittest::TestPackedExtensions::
                                          GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x11_,_true,_0>
                                                    ((TestPackedExtensions *)
                                                     gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x11_,_true>
                                                  *)&proto2_unittest::packed_sint32_extension,0);
                              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                        ((EqHelper *)local_318,"605",
                                         "message.GetExtension(Traits::packed_sint32_extension, 0)",
                                         &local_31c,&local_320);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_318);
                              if (!bVar1) {
                                testing::Message::Message(&local_328);
                                pcVar2 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_318);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0xefe,pcVar2);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_19.message_,&local_328);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_19.message_);
                                testing::Message::~Message(&local_328);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_318);
                              local_344 = 0x25e;
                              local_350 = proto2_unittest::TestPackedExtensions::
                                          GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x12_,_true,_0>
                                                    ((TestPackedExtensions *)
                                                     gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x12_,_true>
                                                  *)proto2_unittest::packed_sint64_extension,0);
                              testing::internal::EqHelper::Compare<int,_long,_nullptr>
                                        ((EqHelper *)local_340,"606",
                                         "message.GetExtension(Traits::packed_sint64_extension, 0)",
                                         &local_344,&local_350);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_340);
                              if (!bVar1) {
                                testing::Message::Message(&local_358);
                                pcVar2 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_340);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0xeff,pcVar2);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_20.message_,&local_358);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_20.message_);
                                testing::Message::~Message(&local_358);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_340);
                              local_378[1] = 0x25f;
                              local_378[0] = proto2_unittest::TestPackedExtensions::
                                             GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,_(unsigned_char)__a_,_true,_0>
                                                       ((TestPackedExtensions *)
                                                        gtest_ar.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,_(unsigned_char)__a_,_true>
                                                  *)&proto2_unittest::packed_fixed32_extension,0);
                              testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
                                        ((EqHelper *)local_370,"607",
                                         "message.GetExtension(Traits::packed_fixed32_extension, 0)"
                                         ,(int *)(local_378 + 1),local_378);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_370);
                              if (!bVar1) {
                                testing::Message::Message(&local_380);
                                pcVar2 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_370);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0xf00,pcVar2);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_21.message_,&local_380);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_21.message_);
                                testing::Message::~Message(&local_380);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_370);
                              local_39c = 0x260;
                              local_3a8 = proto2_unittest::TestPackedExtensions::
                                          GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x06_,_true,_0>
                                                    ((TestPackedExtensions *)
                                                     gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x06_,_true>
                                                  *)proto2_unittest::packed_fixed64_extension,0);
                              testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
                                        ((EqHelper *)local_398,"608",
                                         "message.GetExtension(Traits::packed_fixed64_extension, 0)"
                                         ,&local_39c,&local_3a8);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_398);
                              if (!bVar1) {
                                testing::Message::Message(&local_3b0);
                                pcVar2 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_398);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0xf01,pcVar2);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_22.message_,&local_3b0);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_22.message_);
                                testing::Message::~Message(&local_3b0);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_398);
                              local_3cc = 0x261;
                              local_3d0 = proto2_unittest::TestPackedExtensions::
                                          GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x0f_,_true,_0>
                                                    ((TestPackedExtensions *)
                                                     gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x0f_,_true>
                                                  *)&proto2_unittest::packed_sfixed32_extension,0);
                              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                        ((EqHelper *)local_3c8,"609",
                                         "message.GetExtension(Traits::packed_sfixed32_extension, 0)"
                                         ,&local_3cc,&local_3d0);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_3c8);
                              if (!bVar1) {
                                testing::Message::Message(&local_3d8);
                                pcVar2 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_3c8);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0xf02,pcVar2);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_23.message_,&local_3d8);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_23.message_);
                                testing::Message::~Message(&local_3d8);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_3c8);
                              local_3f4 = 0x262;
                              local_400 = proto2_unittest::TestPackedExtensions::
                                          GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x10_,_true,_0>
                                                    ((TestPackedExtensions *)
                                                     gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x10_,_true>
                                                  *)proto2_unittest::packed_sfixed64_extension,0);
                              testing::internal::EqHelper::Compare<int,_long,_nullptr>
                                        ((EqHelper *)local_3f0,"610",
                                         "message.GetExtension(Traits::packed_sfixed64_extension, 0)"
                                         ,&local_3f4,&local_400);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_3f0);
                              if (!bVar1) {
                                testing::Message::Message(&local_408);
                                pcVar2 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_3f0);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0xf03,pcVar2);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_24.message_,&local_408);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_24.message_);
                                testing::Message::~Message(&local_408);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_3f0);
                              local_424 = 0x263;
                              local_428 = proto2_unittest::TestPackedExtensions::
                                          GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<float>,_(unsigned_char)__x02_,_true,_0>
                                                    ((TestPackedExtensions *)
                                                     gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<float>,_(unsigned_char)__x02_,_true>
                                                  *)&proto2_unittest::packed_float_extension,0);
                              testing::internal::EqHelper::Compare<int,_float,_nullptr>
                                        ((EqHelper *)local_420,"611",
                                         "message.GetExtension(Traits::packed_float_extension, 0)",
                                         &local_424,&local_428);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_420);
                              if (!bVar1) {
                                testing::Message::Message(&local_430);
                                pcVar2 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_420);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0xf04,pcVar2);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_25.message_,&local_430);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_25.message_);
                                testing::Message::~Message(&local_430);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_420);
                              local_44c = 0x264;
                              local_458 = proto2_unittest::TestPackedExtensions::
                                          GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<double>,_(unsigned_char)__x01_,_true,_0>
                                                    ((TestPackedExtensions *)
                                                     gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<double>,_(unsigned_char)__x01_,_true>
                                                  *)proto2_unittest::packed_double_extension,0);
                              testing::internal::EqHelper::Compare<int,_double,_nullptr>
                                        ((EqHelper *)local_448,"612",
                                         "message.GetExtension(Traits::packed_double_extension, 0)",
                                         &local_44c,&local_458);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_448);
                              if (!bVar1) {
                                testing::Message::Message(&local_460);
                                pcVar2 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_448);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0xf05,pcVar2);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_.message_,&local_460);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_.message_);
                                testing::Message::~Message(&local_460);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_448);
                              local_479 = proto2_unittest::TestPackedExtensions::
                                          GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<bool>,_(unsigned_char)__b_,_true,_0>
                                                    ((TestPackedExtensions *)
                                                     gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<bool>,_(unsigned_char)__b_,_true>
                                                  *)&proto2_unittest::packed_bool_extension,0);
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_478,&local_479,(type *)0x0);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_478);
                              if (!bVar1) {
                                testing::Message::Message(&local_488);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&gtest_ar_26.message_,(internal *)local_478,
                                           (AssertionResult *)
                                           "message.GetExtension(Traits::packed_bool_extension, 0)",
                                           "false","true",in_R9);
                                pcVar2 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_490,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0xf06,pcVar2);
                                testing::internal::AssertHelper::operator=(&local_490,&local_488);
                                testing::internal::AssertHelper::~AssertHelper(&local_490);
                                std::__cxx11::string::~string((string *)&gtest_ar_26.message_);
                                testing::Message::~Message(&local_488);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_478);
                              local_4c4 = proto2_unittest::TestPackedExtensions::
                                          GetExtension<google::protobuf::internal::RepeatedEnumTypeTraits<proto2_unittest::ForeignEnum>,_(unsigned_char)__x0e_,_true,_0>
                                                    ((TestPackedExtensions *)
                                                     gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,
                                                  (
                                                  ExtensionIdentifier<proto2_unittest::TestPackedExtensions,_google::protobuf::internal::RepeatedEnumTypeTraits<proto2_unittest::ForeignEnum>,_(unsigned_char)__x0e_,_true>
                                                  *)&proto2_unittest::packed_enum_extension,0);
                              testing::internal::EqHelper::
                              Compare<proto2_unittest::ForeignEnum,_proto2_unittest::ForeignEnum,_nullptr>
                                        ((EqHelper *)local_4c0,"Traits::FOREIGN_BAR",
                                         "message.GetExtension(Traits::packed_enum_extension, 0)",
                                         &TestUtilTraits<proto2_unittest::TestAllExtensions>::
                                          FOREIGN_BAR,&local_4c4);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_4c0);
                              if (!bVar1) {
                                testing::Message::Message(&local_4d0);
                                pcVar2 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_4c0);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_4d8,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0xf08,pcVar2);
                                testing::internal::AssertHelper::operator=(&local_4d8,&local_4d0);
                                testing::internal::AssertHelper::~AssertHelper(&local_4d8);
                                testing::Message::~Message(&local_4d0);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_4c0);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ExpectLastRepeatedExtensionsRemovedPacked(
    const TestPackedExtensions& message) {
  using Traits = TestUtilTraits<TestPackedExtensions>;
  // Test that one element was removed.
  ASSERT_EQ(1, message.ExtensionSize(Traits::packed_int32_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::packed_int64_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::packed_uint32_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::packed_uint64_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::packed_sint32_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::packed_sint64_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::packed_fixed32_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::packed_fixed64_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::packed_sfixed32_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::packed_sfixed64_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::packed_float_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::packed_double_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::packed_bool_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::packed_enum_extension));

  // Test that the remaining element is the correct one.
  EXPECT_EQ(601, message.GetExtension(Traits::packed_int32_extension, 0));
  EXPECT_EQ(602, message.GetExtension(Traits::packed_int64_extension, 0));
  EXPECT_EQ(603, message.GetExtension(Traits::packed_uint32_extension, 0));
  EXPECT_EQ(604, message.GetExtension(Traits::packed_uint64_extension, 0));
  EXPECT_EQ(605, message.GetExtension(Traits::packed_sint32_extension, 0));
  EXPECT_EQ(606, message.GetExtension(Traits::packed_sint64_extension, 0));
  EXPECT_EQ(607, message.GetExtension(Traits::packed_fixed32_extension, 0));
  EXPECT_EQ(608, message.GetExtension(Traits::packed_fixed64_extension, 0));
  EXPECT_EQ(609, message.GetExtension(Traits::packed_sfixed32_extension, 0));
  EXPECT_EQ(610, message.GetExtension(Traits::packed_sfixed64_extension, 0));
  EXPECT_EQ(611, message.GetExtension(Traits::packed_float_extension, 0));
  EXPECT_EQ(612, message.GetExtension(Traits::packed_double_extension, 0));
  EXPECT_TRUE(message.GetExtension(Traits::packed_bool_extension, 0));
  EXPECT_EQ(Traits::FOREIGN_BAR,
            message.GetExtension(Traits::packed_enum_extension, 0));
}